

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls_scache.c
# Opt level: O2

CURLcode cf_ssl_find_peer_by_key
                   (Curl_easy *data,Curl_ssl_scache *scache,char *ssl_peer_key,
                   ssl_primary_config *conn_config,Curl_ssl_scache_peer **ppeer)

{
  curl_trc_feat *pcVar1;
  Curl_ssl_scache_peer *pCVar2;
  _Bool _Var3;
  int iVar4;
  CURLcode CVar5;
  ulong uVar6;
  char *pcVar7;
  long lVar8;
  ulong uVar9;
  size_t local_70;
  uchar my_hmac [32];
  
  *ppeer = (Curl_ssl_scache_peer *)0x0;
  if (scache->magic != 0xe1551) {
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x897 & 0x40) != 0)) &&
      ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)))) &&
     (0 < Curl_trc_feat_ssls.log_level)) {
    Curl_trc_ssls(data,"find peer slot for %s among %zu slots",ssl_peer_key,scache->peer_count);
  }
  lVar8 = 0;
  for (uVar9 = 0; uVar6 = scache->peer_count, uVar9 < uVar6; uVar9 = uVar9 + 1) {
    pcVar7 = *(char **)(scache->peers->key_salt + lVar8 + -0x50);
    if (((pcVar7 != (char *)0x0) && (iVar4 = curl_strequal(ssl_peer_key,pcVar7), iVar4 != 0)) &&
       (_Var3 = cf_ssl_scache_match_auth
                          ((Curl_ssl_scache_peer *)(scache->peers->key_salt + lVar8 + -0x50),
                           conn_config), _Var3)) {
      *ppeer = (Curl_ssl_scache_peer *)(scache->peers->key_salt + lVar8 + -0x50);
      return CURLE_OK;
    }
    lVar8 = lVar8 + 0xa8;
  }
  lVar8 = 0;
  uVar9 = 0;
  local_70 = 0;
  do {
    if (uVar6 <= uVar9) {
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x897 & 0x40) != 0)) &&
         (((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level))
          && (0 < Curl_trc_feat_ssls.log_level)))) {
        Curl_trc_ssls(data,"peer not found for %s",ssl_peer_key);
      }
      return CURLE_OK;
    }
    pCVar2 = scache->peers;
    if (((*(long *)(pCVar2->key_salt + lVar8 + -0x50) == 0) &&
        ((pCVar2->key_hmac[lVar8 + 0x30] & 1) != 0)) &&
       (_Var3 = cf_ssl_scache_match_auth
                          ((Curl_ssl_scache_peer *)(pCVar2->key_salt + lVar8 + -0x50),conn_config),
       _Var3)) {
      if (local_70 == 0) {
        local_70 = strlen(ssl_peer_key);
      }
      CVar5 = Curl_hmacit(&Curl_HMAC_SHA256,scache->peers->key_salt + lVar8,0x20,
                          (uchar *)ssl_peer_key,local_70,my_hmac);
      if (CVar5 != CURLE_OK) {
        return CVar5;
      }
      iVar4 = bcmp(scache->peers->key_hmac + lVar8,my_hmac,0x20);
      if (iVar4 == 0) {
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x897 & 0x40) != 0)) &&
           (((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)
             ) && (0 < Curl_trc_feat_ssls.log_level)))) {
          Curl_trc_ssls(data,"peer entry %zu key recovered: %s",uVar9,ssl_peer_key);
        }
        pcVar7 = (*Curl_cstrdup)(ssl_peer_key);
        pCVar2 = scache->peers;
        *(char **)(pCVar2->key_salt + lVar8 + -0x50) = pcVar7;
        if (pcVar7 != (char *)0x0) {
          cf_ssl_cache_peer_update((Curl_ssl_scache_peer *)(pCVar2->key_salt + lVar8 + -0x50));
          *ppeer = (Curl_ssl_scache_peer *)(scache->peers->key_salt + lVar8 + -0x50);
          return CURLE_OK;
        }
        return CURLE_OUT_OF_MEMORY;
      }
    }
    uVar9 = uVar9 + 1;
    uVar6 = scache->peer_count;
    lVar8 = lVar8 + 0xa8;
  } while( true );
}

Assistant:

static CURLcode
cf_ssl_find_peer_by_key(struct Curl_easy *data,
                        struct Curl_ssl_scache *scache,
                        const char *ssl_peer_key,
                        struct ssl_primary_config *conn_config,
                        struct Curl_ssl_scache_peer **ppeer)
{
  size_t i, peer_key_len = 0;
  CURLcode result = CURLE_OK;

  *ppeer = NULL;
  if(!GOOD_SCACHE(scache)) {
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }

  CURL_TRC_SSLS(data, "find peer slot for %s among %zu slots",
                ssl_peer_key, scache->peer_count);

  /* check for entries with known peer_key */
  for(i = 0; scache && i < scache->peer_count; i++) {
    if(scache->peers[i].ssl_peer_key &&
       strcasecompare(ssl_peer_key, scache->peers[i].ssl_peer_key) &&
       cf_ssl_scache_match_auth(&scache->peers[i], conn_config)) {
      /* yes, we have a cached session for this! */
      *ppeer = &scache->peers[i];
      goto out;
    }
  }
  /* check for entries with HMAC set but no known peer_key */
  for(i = 0; scache && i < scache->peer_count; i++) {
    if(!scache->peers[i].ssl_peer_key &&
       scache->peers[i].hmac_set &&
       cf_ssl_scache_match_auth(&scache->peers[i], conn_config)) {
      /* possible entry with unknown peer_key, check hmac */
      unsigned char my_hmac[CURL_SHA256_DIGEST_LENGTH];
      if(!peer_key_len) /* we are lazy */
        peer_key_len = strlen(ssl_peer_key);
      result = Curl_hmacit(&Curl_HMAC_SHA256,
                           scache->peers[i].key_salt,
                           sizeof(scache->peers[i].key_salt),
                           (const unsigned char *)ssl_peer_key,
                           peer_key_len,
                           my_hmac);
      if(result)
        goto out;
      if(!memcmp(scache->peers[i].key_hmac, my_hmac, sizeof(my_hmac))) {
        /* remember peer_key for future lookups */
        CURL_TRC_SSLS(data, "peer entry %zu key recovered: %s",
                      i, ssl_peer_key);
        scache->peers[i].ssl_peer_key = strdup(ssl_peer_key);
        if(!scache->peers[i].ssl_peer_key) {
          result = CURLE_OUT_OF_MEMORY;
          goto out;
        }
        cf_ssl_cache_peer_update(&scache->peers[i]);
        *ppeer = &scache->peers[i];
        goto out;
      }
    }
  }
  CURL_TRC_SSLS(data, "peer not found for %s", ssl_peer_key);
out:
  return result;
}